

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  bool bVar1;
  TonkResult TVar2;
  TonkJson *in_RDX;
  TonkSocket *in_RSI;
  TonkSocketConfig *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  if ((fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0) && (bVar1 = LoadTonkLibrary(), !bVar1)
     ) {
    if (in_RSI != (TonkSocket *)0x0) {
      *in_RSI = (TonkSocket)0x0;
    }
    if (in_RDX != (TonkJson *)0x0) {
      SafeCopyCStr(in_RDX->JsonString,in_stack_ffffffffffffffd8,(char *)0x10fd58);
    }
    return Tonk_DLL_Not_Found;
  }
  TVar2 = (*fp_tonk_socket_create)(in_RDI,in_RSI,in_RDX);
  return TVar2;
}

Assistant:

TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    if (!fp_tonk_socket_create &&
        !LoadTonkLibrary())
    {
        if (socketOut) {
            *socketOut = nullptr;
        }
        if (errorJsonOut) {
            SafeCopyCStr(
                &errorJsonOut->JsonString[0],
                sizeof(TonkJson::JsonString),
                "{ \"description\": \"Tonk DLL Not Found\" }");
        }
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_socket_create(
        config,
        socketOut,
        errorJsonOut);
}